

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_channel_converter_process_pcm_frames__simple_shuffle
                    (ma_channel_converter *pConverter,void *pFramesOut,void *pFramesIn,
                    ma_uint64 frameCount)

{
  float *pFramesInF32;
  float *pFramesOutF32;
  ma_int16 *pFramesInS16;
  ma_int16 *pFramesOutS16;
  ma_uint32 iChannelIn;
  ma_uint32 iFrame;
  ma_uint64 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_channel_converter *pConverter_local;
  
  if (pConverter == (ma_channel_converter *)0x0) {
    __assert_fail("pConverter != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x857d,
                  "ma_result ma_channel_converter_process_pcm_frames__simple_shuffle(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pFramesOut == (void *)0x0) {
    __assert_fail("pFramesOut != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x857e,
                  "ma_result ma_channel_converter_process_pcm_frames__simple_shuffle(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pFramesIn == (void *)0x0) {
    __assert_fail("pFramesIn != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x857f,
                  "ma_result ma_channel_converter_process_pcm_frames__simple_shuffle(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->channelsIn != pConverter->channelsOut) {
    __assert_fail("pConverter->channelsIn == pConverter->channelsOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x8580,
                  "ma_result ma_channel_converter_process_pcm_frames__simple_shuffle(ma_channel_converter *, void *, const void *, ma_uint64)"
                 );
  }
  if (pConverter->format == ma_format_s16) {
    for (pFramesOutS16._4_4_ = 0; pFramesOutS16._4_4_ < frameCount;
        pFramesOutS16._4_4_ = pFramesOutS16._4_4_ + 1) {
      for (pFramesOutS16._0_4_ = 0; (uint)pFramesOutS16 < pConverter->channelsIn;
          pFramesOutS16._0_4_ = (uint)pFramesOutS16 + 1) {
        *(undefined2 *)((long)pFramesOut + (ulong)pConverter->shuffleTable[(uint)pFramesOutS16] * 2)
             = *(undefined2 *)((long)pFramesIn + (ulong)(uint)pFramesOutS16 * 2);
      }
    }
  }
  else {
    for (pFramesOutS16._4_4_ = 0; pFramesOutS16._4_4_ < frameCount;
        pFramesOutS16._4_4_ = pFramesOutS16._4_4_ + 1) {
      for (pFramesOutS16._0_4_ = 0; (uint)pFramesOutS16 < pConverter->channelsIn;
          pFramesOutS16._0_4_ = (uint)pFramesOutS16 + 1) {
        *(undefined4 *)((long)pFramesOut + (ulong)pConverter->shuffleTable[(uint)pFramesOutS16] * 4)
             = *(undefined4 *)((long)pFramesIn + (ulong)(uint)pFramesOutS16 * 4);
      }
    }
  }
  return 0;
}

Assistant:

static ma_result ma_channel_converter_process_pcm_frames__simple_shuffle(ma_channel_converter* pConverter, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_uint32 iFrame;
    ma_uint32 iChannelIn;

    MA_ASSERT(pConverter != NULL);
    MA_ASSERT(pFramesOut != NULL);
    MA_ASSERT(pFramesIn  != NULL);
    MA_ASSERT(pConverter->channelsIn == pConverter->channelsOut);

    if (pConverter->format == ma_format_s16) {
        /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
        const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

        for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                pFramesOutS16[pConverter->shuffleTable[iChannelIn]] = pFramesInS16[iChannelIn];
            }
        }
    } else {
        /* */ float* pFramesOutF32 = (      float*)pFramesOut;
        const float* pFramesInF32  = (const float*)pFramesIn;

        for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
            for (iChannelIn = 0; iChannelIn < pConverter->channelsIn; ++iChannelIn) {
                pFramesOutF32[pConverter->shuffleTable[iChannelIn]] = pFramesInF32[iChannelIn];
            }
        }
    }

    return MA_SUCCESS;
}